

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this,VerySimpleReadOnlyString *b)

{
  int iVar1;
  uchar *puVar2;
  tCharPtr pcVar3;
  VerySimpleReadOnlyString *b_local;
  String *this_local;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  iVar1 = Strings::VerySimpleReadOnlyString::getLength(b);
  if (-1 < iVar1) {
    iVar1 = Strings::VerySimpleReadOnlyString::getLength(b);
    (this->super_tagbstring).mlen = iVar1 + 1;
    iVar1 = Strings::VerySimpleReadOnlyString::getLength(b);
    (this->super_tagbstring).slen = iVar1;
    puVar2 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar2;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0xcd,"Failure in block constructor");
  }
  else {
    if (0 < (this->super_tagbstring).slen) {
      pcVar3 = Strings::VerySimpleReadOnlyString::getData(b);
      if (pcVar3 != (tCharPtr)0x0) {
        puVar2 = (this->super_tagbstring).data;
        pcVar3 = Strings::VerySimpleReadOnlyString::getData(b);
        memcpy(puVar2,pcVar3,(long)(this->super_tagbstring).slen);
      }
    }
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(const Strings::VerySimpleReadOnlyString & b)
    {
        slen = mlen = 0; data = 0;
        if (b.getLength() >= 0)
        {
            mlen = b.getLength() + 1;
            slen = b.getLength();
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in block constructor");
        }
        else
        {
            if (slen > 0 && b.getData())    memcpy(data, b.getData(), slen);
            data[slen] = '\0';
        }
    }